

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isPureIntTester(TesterType tester)

{
  bool local_9;
  TesterType tester_local;
  
  switch(tester) {
  case TESTER_TEXTURE_SWIZZLE_R:
  case TESTER_TEXTURE_SWIZZLE_R_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_SWIZZLE_R_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_SWIZZLE_G:
  case TESTER_TEXTURE_SWIZZLE_G_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_SWIZZLE_G_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_SWIZZLE_B:
  case TESTER_TEXTURE_SWIZZLE_B_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_SWIZZLE_B_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_SWIZZLE_A:
  case TESTER_TEXTURE_SWIZZLE_A_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_SWIZZLE_A_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_WRAP_S:
  case TESTER_TEXTURE_WRAP_S_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_WRAP_S_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_WRAP_T:
  case TESTER_TEXTURE_WRAP_T_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_WRAP_T_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_WRAP_R:
  case TESTER_TEXTURE_WRAP_R_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_WRAP_R_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_MAG_FILTER:
  case TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_MIN_FILTER:
  case TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_MIN_LOD:
  case TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_MIN_LOD_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_MAX_LOD:
  case TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_MAX_LOD_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_BASE_LEVEL:
  case TESTER_TEXTURE_BASE_LEVEL_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_BASE_LEVEL_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_MAX_LEVEL:
  case TESTER_TEXTURE_MAX_LEVEL_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_MAX_LEVEL_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_COMPARE_MODE:
  case TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_COMPARE_FUNC:
  case TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_IMMUTABLE_LEVELS:
  case TESTER_TEXTURE_IMMUTABLE_FORMAT:
  case TESTER_TEXTURE_BORDER_COLOR:
  case TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER:
  case TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER:
  case TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER:
    local_9 = false;
    break;
  case TESTER_DEPTH_STENCIL_TEXTURE_MODE:
  case TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_INT:
    local_9 = true;
    break;
  case TESTER_TEXTURE_SRGB_DECODE_EXT:
  case TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT:
    local_9 = false;
    break;
  case TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT:
    local_9 = true;
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool isPureIntTester (TesterType tester)
{
#define HANDLE_ALL_SETTERS(X) \
		case X: \
		case X ## _SET_PURE_UINT: return false; \
		case X ## _SET_PURE_INT: return true;

	switch (tester)
	{
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_R)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_G)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_B)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_A)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_WRAP_S)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_WRAP_T)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_WRAP_R)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MAG_FILTER)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MIN_FILTER)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MIN_LOD)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MAX_LOD)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_BASE_LEVEL)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MAX_LEVEL)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_COMPARE_MODE)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_COMPARE_FUNC)
		HANDLE_ALL_SETTERS(TESTER_DEPTH_STENCIL_TEXTURE_MODE)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SRGB_DECODE_EXT)

		case TESTER_TEXTURE_IMMUTABLE_LEVELS:
		case TESTER_TEXTURE_IMMUTABLE_FORMAT:
		case TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER:
		case TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER:
		case TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER:
		case TESTER_TEXTURE_BORDER_COLOR:
			return false;

		default:
			DE_ASSERT(false);
			return false;
	}

#undef HANDLE_ALL_SETTERS
}